

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertySpecification.cpp
# Opt level: O3

String * __thiscall
Rml::PropertySpecification::PropertiesToString_abi_cxx11_
          (String *__return_storage_ptr__,PropertySpecification *this,PropertyDictionary *dictionary
          ,bool include_name,char delimiter)

{
  NodePtr pDVar1;
  Node *pNVar2;
  PropertyIdNameMap *pPVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  pointer pPVar7;
  Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
  *pTVar8;
  ulong *puVar9;
  uint uVar10;
  PropertyMap *this_00;
  ulong uVar11;
  size_t sVar12;
  long *plVar13;
  undefined7 in_register_00000009;
  long *plVar14;
  pointer pPVar15;
  uint8_t *puVar16;
  ulong *puVar17;
  pair<Rml::PropertyId,_Rml::Property> *pair;
  NodePtr pDVar18;
  PropertyMap *__range1;
  const_iterator cVar19;
  PropertyId id;
  String *result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  Vector<PropertyId> ids;
  PropertyId local_c1;
  String *local_c0;
  long *local_b8;
  long local_b0;
  long local_a8;
  long lStack_a0;
  vector<Rml::PropertyId,_std::allocator<Rml::PropertyId>_> local_98;
  int local_78;
  undefined4 local_74;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70;
  PropertySpecification *local_68;
  Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
  *local_60;
  PropertyId *local_58;
  String local_50;
  
  local_74 = (undefined4)CONCAT71(in_register_00000009,include_name);
  local_c0 = __return_storage_ptr__;
  local_68 = this;
  this_00 = PropertyDictionary::GetProperties(dictionary);
  local_98.super__Vector_base<Rml::PropertyId,_std::allocator<Rml::PropertyId>_>._M_impl.
  super__Vector_impl_data._M_start = (PropertyId *)0x0;
  local_98.super__Vector_base<Rml::PropertyId,_std::allocator<Rml::PropertyId>_>._M_impl.
  super__Vector_impl_data._M_finish = (PropertyId *)0x0;
  local_98.super__Vector_base<Rml::PropertyId,_std::allocator<Rml::PropertyId>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (PropertyId *)0x0;
  ::std::vector<Rml::PropertyId,_std::allocator<Rml::PropertyId>_>::reserve
            (&local_98,this_00->mNumElements);
  cVar19 = robin_hood::detail::
           Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
           ::cbegin(this_00);
  pDVar1 = (NodePtr)this_00->mInfo;
  if (cVar19.mKeyVals != pDVar1) {
    do {
      puVar16 = cVar19.mInfo;
      pDVar18 = cVar19.mKeyVals;
      if (local_98.super__Vector_base<Rml::PropertyId,_std::allocator<Rml::PropertyId>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_98.super__Vector_base<Rml::PropertyId,_std::allocator<Rml::PropertyId>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        ::std::vector<Rml::PropertyId,std::allocator<Rml::PropertyId>>::
        _M_realloc_insert<Rml::PropertyId_const&>
                  ((vector<Rml::PropertyId,std::allocator<Rml::PropertyId>> *)&local_98,
                   (iterator)
                   local_98.super__Vector_base<Rml::PropertyId,_std::allocator<Rml::PropertyId>_>.
                   _M_impl.super__Vector_impl_data._M_finish,(PropertyId *)pDVar18);
      }
      else {
        *local_98.super__Vector_base<Rml::PropertyId,_std::allocator<Rml::PropertyId>_>._M_impl.
         super__Vector_impl_data._M_finish = (pDVar18->mData).first;
        local_98.super__Vector_base<Rml::PropertyId,_std::allocator<Rml::PropertyId>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_98.super__Vector_base<Rml::PropertyId,_std::allocator<Rml::PropertyId>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      pDVar18 = pDVar18 + 1;
      uVar11 = *(ulong *)(puVar16 + 1);
      if (uVar11 == 0) {
        puVar9 = (ulong *)(puVar16 + 9);
        do {
          puVar17 = puVar9;
          pDVar18 = pDVar18 + 8;
          uVar11 = *puVar17;
          puVar9 = puVar17 + 1;
        } while (uVar11 == 0);
      }
      else {
        puVar17 = (ulong *)(puVar16 + 1);
      }
      uVar5 = 0;
      if (uVar11 != 0) {
        for (; (uVar11 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
        }
      }
      uVar11 = uVar5 >> 3 & 0x1fffffff;
      cVar19.mInfo = (uint8_t *)((long)puVar17 + uVar11);
      cVar19.mKeyVals = pDVar18 + uVar11;
    } while (pDVar18 + uVar11 != pDVar1);
  }
  pPVar7 = local_98.super__Vector_base<Rml::PropertyId,_std::allocator<Rml::PropertyId>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pPVar15 = local_98.super__Vector_base<Rml::PropertyId,_std::allocator<Rml::PropertyId>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (local_98.super__Vector_base<Rml::PropertyId,_std::allocator<Rml::PropertyId>_>._M_impl.
      super__Vector_impl_data._M_start ==
      local_98.super__Vector_base<Rml::PropertyId,_std::allocator<Rml::PropertyId>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    (local_c0->_M_dataplus)._M_p = (pointer)&local_c0->field_2;
    local_c0->_M_string_length = 0;
    (local_c0->field_2)._M_local_buf[0] = '\0';
  }
  else {
    lVar6 = 0x3f;
    if ((long)local_98.super__Vector_base<Rml::PropertyId,_std::allocator<Rml::PropertyId>_>._M_impl
              .super__Vector_impl_data._M_finish -
        (long)local_98.super__Vector_base<Rml::PropertyId,_std::allocator<Rml::PropertyId>_>._M_impl
              .super__Vector_impl_data._M_start != 0) {
      for (; (ulong)((long)local_98.
                           super__Vector_base<Rml::PropertyId,_std::allocator<Rml::PropertyId>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)local_98.
                          super__Vector_base<Rml::PropertyId,_std::allocator<Rml::PropertyId>_>.
                          _M_impl.super__Vector_impl_data._M_start) >> lVar6 == 0;
          lVar6 = lVar6 + -1) {
      }
    }
    ::std::
    __introsort_loop<__gnu_cxx::__normal_iterator<Rml::PropertyId*,std::vector<Rml::PropertyId,std::allocator<Rml::PropertyId>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_98.super__Vector_base<Rml::PropertyId,_std::allocator<Rml::PropertyId>_>.
               _M_impl.super__Vector_impl_data._M_start,
               local_98.super__Vector_base<Rml::PropertyId,_std::allocator<Rml::PropertyId>_>.
               _M_impl.super__Vector_impl_data._M_finish,((uint)lVar6 ^ 0x3f) * 2 ^ 0x7e);
    ::std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<Rml::PropertyId*,std::vector<Rml::PropertyId,std::allocator<Rml::PropertyId>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pPVar15,pPVar7);
    (local_c0->_M_dataplus)._M_p = (pointer)&local_c0->field_2;
    local_c0->_M_string_length = 0;
    (local_c0->field_2)._M_local_buf[0] = '\0';
    local_58 = local_98.super__Vector_base<Rml::PropertyId,_std::allocator<Rml::PropertyId>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    if (local_98.super__Vector_base<Rml::PropertyId,_std::allocator<Rml::PropertyId>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_98.super__Vector_base<Rml::PropertyId,_std::allocator<Rml::PropertyId>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      local_78 = (int)delimiter;
      pPVar15 = local_98.super__Vector_base<Rml::PropertyId,_std::allocator<Rml::PropertyId>_>.
                _M_impl.super__Vector_impl_data._M_start;
      local_70 = &local_c0->field_2;
      local_60 = this_00;
      do {
        pTVar8 = local_60;
        local_c1 = *pPVar15;
        sVar12 = robin_hood::detail::
                 Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
                 ::findIdx<Rml::PropertyId>(local_60,&local_c1);
        pNVar2 = pTVar8->mKeyVals;
        if ((char)local_74 != '\0') {
          pPVar3 = (local_68->property_map)._M_t.
                   super___uniq_ptr_impl<Rml::PropertyIdNameMap,_std::default_delete<Rml::PropertyIdNameMap>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_Rml::PropertyIdNameMap_*,_std::default_delete<Rml::PropertyIdNameMap>_>
                   .super__Head_base<0UL,_Rml::PropertyIdNameMap_*,_false>._M_head_impl;
          uVar10 = (uint)local_c1;
          lVar6 = *(long *)&(pPVar3->super_IdNameMap<Rml::PropertyId>).name_map;
          if ((ulong)((long)*(pointer *)
                             ((long)&(pPVar3->super_IdNameMap<Rml::PropertyId>).name_map + 8) -
                      lVar6 >> 5) <= (ulong)local_c1) {
            uVar10 = 0;
          }
          lVar4 = *(long *)(lVar6 + (ulong)(uVar10 << 5));
          local_b8 = &local_a8;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_b8,lVar4,*(long *)(lVar6 + 8 + (ulong)(uVar10 << 5)) + lVar4);
          ::std::__cxx11::string::append((char *)&local_b8);
          ::std::__cxx11::string::_M_append((char *)local_c0,(ulong)local_b8);
          if (local_b8 != &local_a8) {
            operator_delete(local_b8,local_a8 + 1);
          }
        }
        Property::ToString_abi_cxx11_(&local_50,&pNVar2[sVar12].mData.second);
        plVar13 = (long *)::std::__cxx11::string::_M_replace_aux
                                    ((ulong)&local_50,local_50._M_string_length,0,'\x01');
        plVar14 = plVar13 + 2;
        if ((long *)*plVar13 == plVar14) {
          local_a8 = *plVar14;
          lStack_a0 = plVar13[3];
          local_b8 = &local_a8;
        }
        else {
          local_a8 = *plVar14;
          local_b8 = (long *)*plVar13;
        }
        local_b0 = plVar13[1];
        *plVar13 = (long)plVar14;
        plVar13[1] = 0;
        *(undefined1 *)(plVar13 + 2) = 0;
        ::std::__cxx11::string::_M_append((char *)local_c0,(ulong)local_b8);
        if (local_b8 != &local_a8) {
          operator_delete(local_b8,local_a8 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        pPVar15 = pPVar15 + 1;
      } while (pPVar15 != local_58);
      if (local_c0->_M_string_length != 0) {
        ::std::__cxx11::string::pop_back();
      }
    }
  }
  if (local_98.super__Vector_base<Rml::PropertyId,_std::allocator<Rml::PropertyId>_>._M_impl.
      super__Vector_impl_data._M_start != (PropertyId *)0x0) {
    operator_delete(local_98.super__Vector_base<Rml::PropertyId,_std::allocator<Rml::PropertyId>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_98.
                          super__Vector_base<Rml::PropertyId,_std::allocator<Rml::PropertyId>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.
                          super__Vector_base<Rml::PropertyId,_std::allocator<Rml::PropertyId>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return local_c0;
}

Assistant:

String PropertySpecification::PropertiesToString(const PropertyDictionary& dictionary, bool include_name, char delimiter) const
{
	const PropertyMap& properties = dictionary.GetProperties();

	// For determinism we print the strings in order of increasing property ids.
	Vector<PropertyId> ids;
	ids.reserve(properties.size());
	for (auto& pair : properties)
		ids.push_back(pair.first);

	std::sort(ids.begin(), ids.end());

	String result;
	for (PropertyId id : ids)
	{
		const Property& p = properties.find(id)->second;
		if (include_name)
			result += property_map->GetName(id) + ": ";
		result += p.ToString() + delimiter;
	}

	if (!result.empty())
		result.pop_back();

	return result;
}